

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O3

chunk_conflict * town_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  ushort uVar1;
  ulong uVar2;
  _Bool _Var3;
  uint32_t uVar4;
  int iVar5;
  uint uVar6;
  uint32_t uVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  chunk_conflict *source;
  chunk *c;
  feature *pfVar13;
  ulong uVar14;
  square *psVar15;
  ulong uVar16;
  undefined4 extraout_var;
  byte bVar17;
  loc lVar18;
  wchar_t wVar19;
  int iVar20;
  wchar_t wVar21;
  uint uVar22;
  long lVar23;
  loc lVar24;
  loc grid;
  loc_conflict lVar25;
  loc grid_00;
  uint uVar26;
  wchar_t wVar27;
  long lVar28;
  wchar_t wVar29;
  wchar_t wVar30;
  wchar_t wVar31;
  ulong uVar32;
  bool bVar33;
  wchar_t lot_n;
  loc_conflict nw_corner;
  wchar_t lot_s;
  wchar_t lot_e;
  undefined4 uVar34;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 uVar35;
  undefined4 in_stack_fffffffffffffee4;
  wchar_t local_e0;
  wchar_t local_d8;
  wchar_t local_d4;
  wchar_t local_d0;
  wchar_t local_cc;
  wchar_t local_c8;
  wchar_t local_c4;
  ulong local_c0;
  ulong local_b8;
  int local_ac;
  ulong local_a8;
  wchar_t local_a0;
  wchar_t local_9c;
  wchar_t local_98;
  wchar_t local_94;
  int local_90;
  int local_8c;
  loc_conflict local_88;
  loc_conflict local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  loc local_58;
  ulong local_50;
  uint local_44;
  wchar_t local_40;
  wchar_t local_3c;
  player *local_38;
  
  _Var3 = is_daytime();
  local_44 = (uint)(&z_info->town_monsters_day)[!_Var3];
  source = chunk_find_name("Town");
  c = (chunk *)cave_new((uint)z_info->town_hgt,(uint)z_info->town_wid);
  if (source == (chunk_conflict *)0x0) {
    c->depth = (int)p->depth;
    local_38 = p;
    uVar4 = Rand_div(3);
    local_94 = (wchar_t)z_info->town_wid;
    draw_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',L'\x16',L'\0',
                   true);
    iVar5 = uVar4 + 5;
    local_98 = L'\0';
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    local_a0 = iVar5 + L'\x01';
    local_58.x = L'\x01';
    local_58.y = L'\x01';
    local_9c = L'\0';
    local_78 = (ulong)uVar4;
LAB_00148a01:
    do {
      wVar29 = c->height;
      if (L'\x02' < wVar29) {
        uVar32 = (ulong)(uint)c->width;
        lVar23 = 1;
        lVar18 = local_58;
        do {
          if (2 < (int)uVar32) {
            lVar28 = 1;
            lVar24 = lVar18;
            do {
              square_set_feat((chunk_conflict *)c,lVar24,L'\x15');
              lVar28 = lVar28 + 1;
              uVar32 = (ulong)c->width;
              lVar24 = (loc)((long)lVar24 + 1);
            } while (lVar28 < (long)(uVar32 - 1));
            wVar29 = c->height;
          }
          lVar23 = lVar23 + 1;
          lVar18 = (loc)((long)lVar18 + 0x100000000);
        } while (lVar23 < wVar29 + L'\xffffffff');
      }
      wVar19 = local_a0;
      if (-6 < (wchar_t)local_78) {
        do {
          build_streamer((chunk_conflict *)c,L'\x17',L'\0');
          wVar19 = wVar19 + L'\xffffffff';
        } while (wVar19 != L'\0');
        wVar29 = c->height;
      }
      uVar35 = 0;
      uVar34 = 1;
      generate_starburst_room
                (c,L'\0',L'\0',wVar29 + L'\xffffffff',c->width + L'\xffffffff',false,L'\x01',false);
      wVar29 = c->height;
      if (L'\x02' < wVar29) {
        uVar32 = (ulong)(uint)c->width;
        lVar18.x = L'\x01';
        lVar18.y = L'\x01';
        lVar23 = 1;
        do {
          if (2 < (int)uVar32) {
            lVar28 = 1;
            lVar24 = lVar18;
            do {
              psVar15 = square((chunk_conflict *)c,lVar24);
              flag_off(psVar15->info,3,4);
              lVar28 = lVar28 + 1;
              uVar32 = (ulong)c->width;
              lVar24 = (loc)((long)lVar24 + 1);
            } while (lVar28 < (long)(uVar32 - 1));
            wVar29 = c->height;
          }
          lVar23 = lVar23 + 1;
          lVar18 = (loc)((long)lVar18 + 0x100000000);
        } while (lVar23 < wVar29 + L'\xffffffff');
      }
      uVar1 = z_info->town_wid;
      uVar4 = Rand_div(uVar1 / 3 | 1);
      wVar29 = (uVar4 + (uVar1 >> 1)) - z_info->town_wid / 6;
      uVar32 = (ulong)(uint)wVar29;
      _Var3 = square_isfloor((chunk_conflict *)c,(loc)(uVar32 | 0x100000000));
      uVar14 = 1;
      if (!_Var3) {
        lVar18 = (loc)(uVar32 | 0x200000000);
        uVar14 = 1;
        do {
          if (z_info->town_hgt >> 2 <= uVar14) break;
          uVar14 = uVar14 + 1;
          _Var3 = square_isfloor((chunk_conflict *)c,lVar18);
          lVar18 = (loc)((long)lVar18 + 0x100000000);
        } while (!_Var3);
      }
      uVar22 = (uint)uVar14;
    } while (z_info->town_hgt >> 2 <= uVar22);
    local_3c = wVar29 + L'\xffffffff';
    local_40 = uVar22 + L'\x02';
    wVar19 = local_3c;
    do {
      iVar5 = -1;
      do {
        lVar18 = (loc)loc(wVar19,iVar5 + uVar22);
        _Var3 = square_isfiery((chunk_conflict *)c,lVar18);
        if (_Var3) {
          lVar18 = (loc)loc(wVar19,iVar5 + uVar22);
          square_set_feat((chunk_conflict *)c,lVar18,L'\x15');
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 != 2);
      bVar33 = wVar19 <= wVar29;
      wVar19 = wVar19 + L'\x01';
    } while (bVar33);
    uVar1 = z_info->town_hgt;
    uVar4 = Rand_div((uint)(uVar1 >> 2));
    iVar20 = (uVar1 >> 1) - uVar4;
    uVar4 = Rand_div((uint)(z_info->town_hgt >> 3));
    uVar26 = uVar4 + iVar20;
    local_68 = (ulong)uVar26;
    iVar5 = (int)((ulong)((long)wVar29 * -0x2aaaaaab) >> 0x20);
    uVar16 = (ulong)(uint)(iVar5 - (iVar5 >> 0x1f));
    local_50 = (ulong)(uint)(((uint)z_info->town_wid - wVar29) / 6);
    uVar6 = uVar4 + iVar20 + 3;
    if (-1 < (int)uVar26) {
      uVar6 = uVar26;
    }
    local_90 = -((int)uVar6 >> 2);
    iVar5 = z_info->town_hgt - uVar26;
    local_8c = iVar5 + 3;
    if (-1 < iVar5) {
      local_8c = iVar5;
    }
    local_8c = local_8c >> 2;
    local_60 = uVar32;
    if (z_info->store_max != 0) {
      local_80.y = uVar26;
      local_80.x = wVar29;
      local_88 = (loc_conflict)((ulong)local_88 & 0xffffffff00000000);
      iVar5 = 0;
      local_70 = uVar16;
      while (uVar32 = local_70, iVar5 < 100) {
LAB_00148d1d:
        while( true ) {
          uVar4 = Rand_div(2);
          if (uVar4 == 0) {
            uVar4 = Rand_div(2);
            uVar6 = -(uint)(uVar4 == 0) | 1;
            iVar20 = rand_range(local_90,local_8c);
            uVar16 = CONCAT44(extraout_var,iVar20);
          }
          else {
            uVar6 = rand_range((int)uVar32,(int)local_50);
            uVar4 = Rand_div(2);
            uVar16 = (ulong)(-(uint)(uVar4 == 0) | 1);
          }
          if (((int)uVar16 == 0) || (uVar6 == 0)) goto LAB_00148e2a;
          lVar25 = (loc_conflict)((ulong)uVar6 | uVar16 << 0x20);
          local_ac = iVar5 + 1;
          local_a8 = uVar16;
          get_lot_bounds(local_80,lVar25,(wchar_t)&local_d0,(wchar_t)&local_cc,&local_d8,&local_d4,
                         (int *)CONCAT44(in_stack_fffffffffffffedc,uVar34),
                         (int *)CONCAT44(in_stack_fffffffffffffee4,uVar35));
          wVar19 = local_cc;
          wVar29 = local_d4;
          local_b8 = CONCAT44(local_b8._4_4_,local_d8);
          if ((4 < local_d8 - local_d0) && (2 < local_d4 - local_cc)) break;
LAB_00148e0b:
          bVar33 = 0x62 < iVar5;
          uVar32 = local_70;
          iVar5 = local_ac;
          if (bVar33) goto LAB_00148a01;
        }
        if (local_d0 <= local_d8) {
          wVar30 = local_d4 + L'\x01';
          wVar31 = local_d0;
          do {
            wVar21 = wVar19;
            if (wVar19 <= wVar29) {
              do {
                lVar24.y = wVar21;
                lVar24.x = wVar31;
                _Var3 = square_isfloor((chunk_conflict *)c,lVar24);
                if (!_Var3) goto LAB_00148e0b;
                wVar21 = wVar21 + L'\x01';
              } while (wVar30 != wVar21);
            }
            bVar33 = wVar31 != (wchar_t)local_b8;
            wVar31 = wVar31 + L'\x01';
          } while (bVar33);
        }
        uVar32 = local_60;
        if (0x62 < iVar5) break;
        iVar5 = (int)local_a8;
        wVar29 = (int)local_68 + iVar5 * 4;
        if (local_98 <= wVar29) {
          local_98 = wVar29;
        }
        wVar29 = (int)local_60 + uVar6 * 6;
        if (wVar29 <= local_94) {
          local_94 = wVar29;
        }
        if (local_9c <= wVar29) {
          local_9c = wVar29;
        }
        get_lot_bounds(local_80,lVar25,(wchar_t)&local_d0,(wchar_t)&local_d8,&local_c4,&local_c8,
                       (int *)CONCAT44(in_stack_fffffffffffffedc,uVar34),
                       (int *)CONCAT44(in_stack_fffffffffffffee4,uVar35));
        wVar29 = local_c4;
        wVar30 = local_c8;
        wVar19 = local_d0;
        wVar31 = local_d8;
        if (uVar6 - 2 < 0xfffffffd) {
          if (iVar5 == -1) {
            wVar27 = local_d8 + L'\x01';
            uVar4 = Rand_div(2);
            if (wVar27 < wVar30 - uVar4) {
              uVar4 = Rand_div(2);
              wVar27 = wVar30 - uVar4;
            }
            wVar8 = wVar27 + L'\xfffffffe';
            wVar9 = wVar27;
          }
          else {
            wVar27 = local_c8 + L'\xffffffff';
            uVar4 = Rand_div(2);
            if (uVar4 + wVar31 < wVar27) {
              uVar4 = Rand_div(2);
              wVar27 = uVar4 + wVar31;
            }
            wVar8 = wVar27;
            wVar9 = wVar27 + L'\x02';
          }
          wVar19 = local_d0;
          local_b8 = (ulong)(uint)wVar30;
          local_a8 = (ulong)(uint)local_c4;
          wVar21 = rand_range(local_d0 + L'\x01',local_c4 + L'\xfffffffe');
          wVar29 = wVar21 + L'\xfffffffe';
          if (wVar21 + L'\xfffffffe' < wVar19) {
            wVar29 = wVar19;
          }
          wVar29 = rand_range(wVar29,wVar21);
          lVar18 = (loc)loc(wVar29 + L'\xffffffff',wVar27);
          _Var3 = square_isfloor((chunk_conflict *)c,lVar18);
          local_e0 = wVar29 + L'\x01';
          wVar30 = local_e0;
          if (local_e0 < wVar21) {
            wVar30 = wVar21;
          }
          if (_Var3) {
            local_e0 = wVar29;
          }
          wVar29 = (wchar_t)local_a8;
          if (_Var3) {
            wVar30 = wVar21;
          }
          wVar21 = wVar30 + L'\x02';
          if (wVar29 <= wVar30 + L'\x02') {
            wVar21 = wVar29;
          }
          wVar21 = rand_range(local_e0 + L'\x02',wVar21);
          if (1 < wVar21 - local_e0) {
            lVar18 = (loc)loc(wVar21 + L'\x01',wVar27);
            _Var3 = square_isfloor((chunk_conflict *)c,lVar18);
            if ((!_Var3) && (wVar21 = wVar21 + L'\xffffffff', wVar21 <= wVar30)) {
              wVar30 = wVar21;
            }
          }
        }
        else if (iVar5 - 2U < 0xfffffffd) {
          if (uVar6 == 0xffffffff) {
            wVar30 = local_d0 + L'\x01';
            uVar16 = (ulong)(uint)local_c4;
            uVar4 = Rand_div(2);
            uVar7 = Rand_div(2);
            if (wVar30 < wVar29 - (uVar7 + uVar4)) {
              uVar4 = Rand_div(2);
              uVar7 = Rand_div(2);
              wVar30 = wVar29 - (uVar7 + uVar4);
            }
            local_e0 = wVar30 + L'\xfffffffe';
            local_a8 = uVar16;
            wVar29 = wVar30;
          }
          else {
            local_a8 = (ulong)(uint)local_c4;
            wVar30 = local_c4 + L'\xffffffff';
            uVar4 = Rand_div(2);
            uVar7 = Rand_div(2);
            if (uVar7 + uVar4 + wVar19 < wVar30) {
              uVar4 = Rand_div(2);
              uVar7 = Rand_div(2);
              wVar30 = uVar7 + uVar4 + wVar19;
            }
            local_e0 = wVar30;
            wVar29 = wVar30 + L'\x02';
          }
          wVar31 = local_d8;
          local_c0 = (ulong)(uint)wVar29;
          local_b8 = (ulong)(uint)local_c8;
          wVar21 = rand_range(local_d8,local_c8 + L'\xffffffff');
          wVar29 = wVar21 + L'\xfffffffe';
          if (wVar21 + L'\xfffffffe' < wVar31) {
            wVar29 = wVar31;
          }
          wVar29 = rand_range(wVar29,wVar21);
          lVar18 = (loc)loc(wVar30,wVar29 + L'\xffffffff');
          _Var3 = square_isfloor((chunk_conflict *)c,lVar18);
          wVar8 = wVar29 + L'\x01';
          wVar27 = wVar8;
          if (wVar8 < wVar21) {
            wVar27 = wVar21;
          }
          if (_Var3) {
            wVar27 = wVar21;
            wVar8 = wVar29;
          }
          wVar29 = wVar8 + L'\x01';
          if (wVar8 + L'\x01' <= wVar27) {
            wVar29 = wVar27;
          }
          iVar5 = wVar27 + L'\x02';
          if ((int)local_b8 < wVar27 + L'\x02') {
            iVar5 = (int)local_b8;
          }
          wVar9 = rand_range(wVar29,iVar5);
          if (wVar9 - wVar8 < 2) {
            wVar29 = (wchar_t)local_a8;
            wVar21 = (wchar_t)local_c0;
          }
          else {
            lVar18 = (loc)loc(wVar30,wVar9 + L'\x01');
            _Var3 = square_isfloor((chunk_conflict *)c,lVar18);
            wVar29 = (wchar_t)local_a8;
            if ((!_Var3) && (wVar9 = wVar9 + L'\xffffffff', wVar9 <= wVar27)) {
              wVar27 = wVar9;
            }
            wVar21 = (wchar_t)local_c0;
          }
        }
        else {
          if ((int)uVar6 < 0) {
            uVar4 = Rand_div(2);
            wVar30 = ~uVar4 + wVar29;
            uVar4 = Rand_div(2);
            wVar21 = wVar29;
            if (uVar4 + wVar30 < wVar29) {
              uVar4 = Rand_div(2);
              wVar21 = uVar4 + wVar30;
            }
            wVar19 = local_d0;
            wVar31 = wVar30 + L'\xfffffffe';
            if (wVar30 + L'\xfffffffe' < local_d0) {
              wVar31 = local_d0;
            }
            local_e0 = rand_range(wVar31,wVar21 + L'\xfffffffe');
          }
          else {
            uVar4 = Rand_div(2);
            wVar30 = wVar19 + uVar4 + L'\x01';
            uVar7 = Rand_div(2);
            local_e0 = wVar19;
            if (wVar19 < wVar30 - uVar7) {
              uVar7 = Rand_div(2);
              local_e0 = wVar30 - uVar7;
            }
            wVar29 = local_c4;
            wVar31 = wVar19 + uVar4 + L'\x03';
            if (local_c4 < wVar31) {
              wVar31 = local_c4;
            }
            wVar21 = rand_range(local_e0 + L'\x02',wVar31);
          }
          wVar27 = local_c8;
          wVar31 = local_d8;
          local_c0 = (ulong)(uint)wVar21;
          if ((long)(uVar16 << 0x20) < 0) {
            uVar16 = (ulong)(uint)local_c8;
            uVar4 = Rand_div(2);
            wVar27 = wVar27 - uVar4;
            local_b8 = uVar16;
            wVar9 = wVar27;
            if (local_e0 == wVar30 || wVar21 == wVar30) {
              uVar4 = Rand_div(2);
              wVar9 = uVar4 + wVar27;
            }
            wVar31 = local_d8;
            wVar8 = wVar27 + L'\xfffffffe';
            if (wVar27 + L'\xfffffffe' < local_d8) {
              wVar8 = local_d8;
            }
            if (wVar9 - wVar8 < 2) {
              wVar21 = (wchar_t)local_c0;
            }
            else {
              lVar18 = (loc)loc(wVar30,wVar8 + L'\xffffffff');
              _Var3 = square_isfloor((chunk_conflict *)c,lVar18);
              if ((!_Var3) && (wVar8 = wVar8 + L'\x01', wVar27 < wVar8)) {
                wVar27 = wVar8;
              }
              wVar21 = (wchar_t)local_c0;
            }
          }
          else {
            local_a8 = (ulong)(uint)wVar29;
            uVar4 = Rand_div(2);
            wVar27 = uVar4 + wVar31;
            wVar8 = wVar27;
            if (local_e0 == wVar30 || wVar21 == wVar30) {
              uVar4 = Rand_div(2);
              wVar8 = wVar27 - uVar4;
            }
            local_b8 = (ulong)(uint)local_c8;
            wVar9 = wVar27 + L'\x02';
            if (local_c8 < wVar27 + L'\x02') {
              wVar9 = local_c8;
            }
            if (wVar9 - wVar8 < 2) {
              wVar21 = (wchar_t)local_c0;
              wVar29 = (wchar_t)local_a8;
            }
            else {
              lVar18 = (loc)loc(wVar30,wVar9 + L'\x01');
              _Var3 = square_isfloor((chunk_conflict *)c,lVar18);
              wVar29 = (wchar_t)local_a8;
              if ((!_Var3) && (wVar9 = wVar9 + L'\xffffffff', wVar9 < wVar27)) {
                wVar27 = wVar9;
              }
              wVar21 = (wchar_t)local_c0;
            }
          }
          if (((int)uVar6 < 0) && (1 < wVar21 - local_e0)) {
            lVar18 = (loc)loc(local_e0 + L'\xffffffff',wVar27);
            _Var3 = square_isfloor((chunk_conflict *)c,lVar18);
            wVar21 = (wchar_t)local_c0;
            if ((!_Var3) && (local_e0 = local_e0 + L'\x01', wVar30 <= local_e0)) {
              wVar30 = local_e0;
            }
          }
          else if ((0 < (int)uVar6) && (1 < wVar21 - local_e0)) {
            lVar18 = (loc)loc(wVar21 + L'\x01',wVar27);
            _Var3 = square_isfloor((chunk_conflict *)c,lVar18);
            if ((!_Var3) && (wVar21 = wVar21 + L'\xffffffff', wVar21 <= wVar30)) {
              wVar30 = wVar21;
            }
          }
        }
        if (wVar19 < local_e0) {
          wVar19 = local_e0;
        }
        if (wVar21 < wVar29) {
          wVar29 = wVar21;
        }
        if (wVar31 < wVar8) {
          wVar31 = wVar8;
        }
        wVar21 = (wchar_t)local_b8;
        if (wVar9 < (wchar_t)local_b8) {
          wVar21 = wVar9;
        }
        uVar34 = 0;
        fill_rectangle(c,wVar31,wVar19,wVar21,wVar29,L'\x16',L'\0');
        local_88.x = local_88.x + 1;
        grid.y = wVar27;
        grid.x = wVar30;
        lVar23 = 0x21;
        wVar29 = L'\0';
        do {
          _Var3 = feat_is_shop(wVar29);
          if ((_Var3) && (local_88.x == (uint)f_info->flags[lVar23 + -0x23])) {
            square_set_feat((chunk_conflict *)c,grid,wVar29);
          }
          lVar23 = lVar23 + 0x70;
          wVar29 = wVar29 + L'\x01';
        } while (lVar23 != 0xb11);
        uVar16 = local_70;
        iVar5 = local_ac;
        if ((uint)z_info->store_max <= (uint)local_88.x) goto LAB_001496d1;
      }
      goto LAB_00148a01;
    }
LAB_001496d1:
    if ((int)uVar16 <= (int)local_50) {
      local_88 = (loc_conflict)(local_68 << 0x20 | uVar32);
      do {
        if (((int)uVar16 != 0) && (uVar2 = uVar16, iVar5 = local_90, local_90 <= local_8c)) {
          do {
            local_70 = uVar2;
            iVar20 = (int)uVar16;
            if ((iVar5 != 0) &&
               ((uVar4 = Rand_div(100), (int)uVar4 < 0x51 && (uVar4 = Rand_div(2), uVar4 == 0)))) {
              lVar25 = loc(iVar20,iVar5);
              get_lot_bounds(local_88,lVar25,(wchar_t)&local_d0,(wchar_t)&local_cc,&local_d8,
                             &local_d4,(int *)CONCAT44(in_stack_fffffffffffffedc,uVar34),
                             (int *)CONCAT44(in_stack_fffffffffffffee4,uVar35));
              wVar29 = local_d4;
              local_a0 = local_d8;
              if (local_d0 <= local_d8) {
                local_78 = CONCAT44(local_78._4_4_,local_cc);
                wVar31 = local_d4 + L'\x01';
                bVar17 = true;
                wVar19 = local_d0;
                do {
                  local_ac = CONCAT31(local_ac._1_3_,bVar17);
                  wVar30 = (wchar_t)local_78;
                  if ((wchar_t)local_78 <= wVar29) {
                    do {
                      grid_00.y = wVar30;
                      grid_00.x = wVar19;
                      psVar15 = square((chunk_conflict *)c,grid_00);
                      _Var3 = feat_is_shop((uint)psVar15->feat);
                      if (_Var3) {
                        bVar17 = (byte)local_ac;
                        goto LAB_00149814;
                      }
                      wVar30 = wVar30 + L'\x01';
                    } while (wVar31 != wVar30);
                  }
                  bVar33 = wVar19 != local_a0;
                  bVar17 = wVar19 < local_a0;
                  wVar19 = wVar19 + L'\x01';
                } while (bVar33);
LAB_00149814:
                iVar20 = (int)local_70;
                uVar16 = local_70;
                uVar32 = local_60;
                if ((bVar17 & 1) != 0) goto LAB_00149b2f;
              }
              lVar25 = loc(iVar20,iVar5);
              get_lot_bounds(local_88,lVar25,(wchar_t)&local_d0,(wchar_t)&local_d8,&local_c4,
                             &local_c8,(int *)CONCAT44(in_stack_fffffffffffffedc,uVar34),
                             (int *)CONCAT44(in_stack_fffffffffffffee4,uVar35));
              wVar19 = local_d0;
              wVar29 = local_d8;
              local_b8 = CONCAT44(local_b8._4_4_,local_c4);
              uVar16 = local_70;
              uVar32 = local_60;
              if ((local_d0 < local_c4) &&
                 (local_80.y = 0, local_80.x = local_c8, local_d8 < local_c8)) {
                iVar20 = rand_range(1,4);
                iVar10 = rand_range(1,2);
                iVar11 = rand_range(1,5 - iVar20);
                iVar12 = rand_range(1,3 - iVar10);
                wVar30 = iVar12 + iVar10 + local_80.x + L'\xfffffffc';
                wVar21 = iVar11 + iVar20 + (wchar_t)local_b8 + L'\xfffffffa';
                uVar34 = 0;
                local_78 = CONCAT44(local_78._4_4_,iVar12 + wVar29);
                local_a8 = CONCAT44(local_a8._4_4_,iVar11 + wVar19);
                fill_rectangle(c,iVar12 + wVar29,iVar11 + wVar19,wVar30,wVar21,L'\x15',L'\0');
                iVar20 = local_80.x;
                wVar31 = wVar19;
                do {
                  local_a0 = CONCAT31(local_a0._1_3_,wVar21 < wVar31 || wVar31 < (wchar_t)local_a8);
                  local_ac = CONCAT31(local_ac._1_3_,wVar31 == L'\x02' || wVar19 < wVar31);
                  local_58.x = wVar31 + L'\xffffffff';
                  wVar27 = wVar29;
                  do {
                    if ((wVar30 < wVar27) || (wVar27 < (wchar_t)local_78 || (char)local_a0 != '\0'))
                    {
                      uVar4 = Rand_div(3);
                      if (uVar4 == 0) {
                        lVar18 = (loc)loc(wVar31,wVar27);
                        _Var3 = square_isfloor((chunk_conflict *)c,lVar18);
                        if (_Var3) {
                          if ((byte)local_ac == '\0') {
                            lVar18 = (loc)loc(local_58.x,wVar27);
                            _Var3 = square_isperm((chunk_conflict *)c,lVar18);
                            if (_Var3) goto LAB_00149af9;
                          }
                          if (((wchar_t)local_b8 <= wVar31) &&
                             (wVar31 != (uint)z_info->town_wid + L'\xfffffffe')) {
                            lVar18 = (loc)loc(wVar31 + L'\x01',wVar27);
                            _Var3 = square_isperm((chunk_conflict *)c,lVar18);
                            if (_Var3) goto LAB_00149af9;
                          }
                          if (wVar27 != L'\x02' && wVar27 <= wVar29) {
                            lVar18 = (loc)loc(wVar31,wVar27 + L'\xffffffff');
                            _Var3 = square_isperm((chunk_conflict *)c,lVar18);
                            if (_Var3) goto LAB_00149af9;
                          }
                          wVar9 = L'\x18';
                          if ((local_80.x <= wVar27) &&
                             (wVar27 != (uint)z_info->town_hgt + L'\xfffffffe')) {
                            lVar18 = (loc)loc(wVar31,wVar27 + L'\x01');
                            _Var3 = square_isperm((chunk_conflict *)c,lVar18);
                            if (_Var3) goto LAB_00149af9;
                          }
LAB_001499bc:
                          lVar18 = (loc)loc(wVar31,wVar27);
                          square_set_feat((chunk_conflict *)c,lVar18,wVar9);
                        }
                      }
                    }
                    else {
                      uVar4 = Rand_div(4);
                      if (uVar4 == 0) {
                        wVar9 = L'\x10';
                        goto LAB_001499bc;
                      }
                    }
LAB_00149af9:
                    wVar27 = wVar27 + L'\x01';
                  } while (iVar20 + L'\x01' != wVar27);
                  bVar33 = wVar31 != (wchar_t)local_b8;
                  uVar16 = local_70;
                  uVar32 = local_60;
                  wVar31 = wVar31 + L'\x01';
                } while (bVar33);
              }
            }
LAB_00149b2f:
            bVar33 = iVar5 != local_8c;
            uVar2 = local_70;
            iVar5 = iVar5 + 1;
          } while (bVar33);
        }
        iVar5 = (int)uVar16;
        uVar16 = (ulong)(iVar5 + 1);
      } while (iVar5 != (int)local_50);
    }
    lVar18 = (loc)loc((int)uVar32,uVar22 + 1);
    square_set_feat((chunk_conflict *)c,lVar18,L'\x01');
    fill_rectangle(c,local_40,local_3c,local_98,(int)uVar32 + L'\x01',L'\x01',L'\0');
    fill_rectangle(c,(wchar_t)local_68,local_94,(wchar_t)local_68 + L'\x01',local_9c,L'\x01',L'\0');
    lVar18 = (loc)(uVar14 << 0x20 | uVar32);
    square_set_feat((chunk_conflict *)c,lVar18,L'\x06');
    p = local_38;
  }
  else {
    c->depth = source->depth;
    _Var3 = chunk_copy((chunk_conflict *)c,p,source,L'\0',L'\0',L'\0',false);
    if (!_Var3) {
      quit_fmt("chunk_copy() level bounds failed!");
    }
    chunk_list_remove("Town");
    cave_free(source);
    wVar29 = c->height;
    if (wVar29 < L'\x01') {
      lVar23 = 0;
      uVar32 = 0;
    }
    else {
      uVar14 = (ulong)(uint)c->width;
      lVar28 = 0;
      lVar23 = 0;
      do {
        uVar32 = 0;
        if (0 < (int)uVar14) {
          do {
            pfVar13 = square_feat((chunk_conflict *)c,(loc)(lVar28 + uVar32));
            if (pfVar13->fidx == L'\x06') goto LAB_00149bf8;
            uVar32 = uVar32 + 1;
            uVar14 = (ulong)c->width;
          } while ((long)uVar32 < (long)uVar14);
          wVar29 = c->height;
        }
        lVar23 = lVar23 + 1;
        lVar28 = lVar28 + 0x100000000;
      } while (lVar23 < wVar29);
    }
LAB_00149bf8:
    lVar18 = (loc)(uVar32 & 0xffffffff | lVar23 << 0x20);
  }
  player_place((chunk_conflict2 *)c,p,(loc_conflict)lVar18);
  _Var3 = is_daytime();
  cave_illuminate(c,_Var3);
  for (uVar22 = local_44; uVar22 != 0; uVar22 = uVar22 - 1) {
    pick_and_place_distant_monster(c,p->grid,L'\x03',true,c->depth);
  }
  return (chunk_conflict *)c;
LAB_00148e2a:
  bVar33 = iVar5 == 99;
  iVar5 = iVar5 + 1;
  if (bVar33) goto LAB_00148a01;
  goto LAB_00148d1d;
}

Assistant:

struct chunk *town_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	int i;
	struct loc grid;
	int residents = is_daytime() ? z_info->town_monsters_day :
		z_info->town_monsters_night;
	struct chunk *c_new, *c_old = chunk_find_name("Town");

	/* Make a new chunk */
	c_new = cave_new(z_info->town_hgt, z_info->town_wid);

	/* First time */
	if (!c_old) {
		c_new->depth = p->depth;

		/* Build stuff */
		town_gen_layout(c_new, p);
	} else {
		/* Copy from the chunk list, remove the old one */
		c_new->depth = c_old->depth;
		if (!chunk_copy(c_new, p, c_old, 0, 0, 0, 0))
			quit_fmt("chunk_copy() level bounds failed!");
		chunk_list_remove("Town");
		cave_free(c_old);

		/* Find the stairs (lame) */
		for (grid.y = 0; grid.y < c_new->height; grid.y++) {
			bool found = false;
			for (grid.x = 0; grid.x < c_new->width; grid.x++) {
				if (square_feat(c_new, grid)->fidx == FEAT_MORE) {
					found = true;
					break;
				}
			}
			if (found) break;
		}

		/* Place the player */
		player_place(c_new, p, grid);
	}

	/* Apply illumination */
	cave_illuminate(c_new, is_daytime());

	/* Make some residents */
	for (i = 0; i < residents; i++) {
		pick_and_place_distant_monster(c_new, p->grid, 3, true,
			c_new->depth);
	}

	return c_new;
}